

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O3

void merge_3way_unstable(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
                        uchar **result)

{
  uchar **ppuVar1;
  uchar **ppuVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  uchar **from1_00;
  uchar *__s2;
  uchar *__s2_00;
  long lVar10;
  long lVar11;
  size_t __n;
  uchar *puVar12;
  uchar **local_60;
  uchar **local_58;
  uchar **local_50;
  size_t local_48;
  size_t local_40;
  uchar **local_38;
  
  puVar12 = *from0;
  local_50 = from0;
  local_58 = from1;
  local_40 = n1;
  local_60 = from2;
  local_48 = n2;
  local_38 = result;
  do {
    if (puVar12 == (uchar *)0x0) {
LAB_001ca5cc:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x36,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2_00 = *local_58;
    if (__s2_00 == (uchar *)0x0) {
LAB_001ca703:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x37,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar4 = strcmp((char *)puVar12,(char *)__s2_00);
    __s2 = *local_60;
    if (__s2 == (uchar *)0x0) goto LAB_001ca703;
    iVar5 = strcmp((char *)__s2_00,(char *)__s2);
    if (iVar4 < 0) {
      lVar8 = 0;
      if (iVar5 < 0) {
LAB_001c9cb8:
        (*(code *)((long)&DAT_001f5898 + (long)(int)(&DAT_001f5898)[lVar8]))();
        return;
      }
      if (iVar5 != 0) {
        iVar4 = strcmp((char *)puVar12,(char *)__s2);
        lVar8 = 1;
        if (iVar4 < 0) goto LAB_001c9cb8;
        if (iVar4 != 0) goto LAB_001c9f07;
LAB_001ca4d0:
        *local_38 = puVar12;
        puVar12 = *local_60;
        local_60 = local_60 + 1;
        local_38[1] = puVar12;
        local_38 = local_38 + 2;
        local_48 = local_48 - 1;
        n0 = n0 - 1;
        sVar9 = local_40;
        if (n0 != 0) {
          local_50 = local_50 + 1;
          from1_00 = local_58;
          ppuVar1 = local_58;
          ppuVar2 = local_50;
          if (local_48 == 0) goto joined_r0x001ca655;
          goto LAB_001ca5b1;
        }
        goto LAB_001ca616;
      }
LAB_001ca2c7:
      lVar8 = 0;
      do {
        *(uchar **)((long)local_38 + lVar8) = puVar12;
        if (n0 == 1) {
          local_38 = (uchar **)((long)local_38 + lVar8 + 8);
          sVar9 = local_40;
          local_48 = local_48;
          goto LAB_001ca616;
        }
        puVar12 = *(uchar **)((long)local_50 + lVar8 + 8);
        if (puVar12 == (uchar *)0x0) goto LAB_001ca5cc;
        __s2_00 = *local_58;
        if (__s2_00 == (uchar *)0x0) goto LAB_001ca703;
        iVar4 = strcmp((char *)puVar12,(char *)__s2_00);
        cVar3 = (iVar4 != 0) * '\x03' + '\t';
        if (iVar4 < 0) {
          cVar3 = '\x04';
        }
        lVar8 = lVar8 + 8;
        n0 = n0 - 1;
      } while (cVar3 == '\x04');
      local_38 = (uchar **)((long)local_38 + lVar8);
      if (cVar3 == '\t') {
        local_50 = (uchar **)((long)local_50 + lVar8);
        goto LAB_001ca3f0;
      }
      local_50 = (uchar **)((long)local_50 + lVar8);
LAB_001ca574:
      *local_38 = __s2_00;
      puVar12 = *local_60;
      local_60 = local_60 + 1;
      local_38[1] = puVar12;
      local_38 = local_38 + 2;
      local_48 = local_48 - 1;
      local_40 = local_40 - 1;
      sVar9 = local_48;
      if (local_40 == 0) {
LAB_001ca68c:
        local_40 = sVar9;
        sVar9 = local_40;
        ppuVar1 = local_60;
        ppuVar2 = local_50;
        if (n0 != 0) goto joined_r0x001ca655;
        goto LAB_001ca6bc;
      }
      local_58 = local_58 + 1;
      from1_00 = local_58;
      if (local_48 != 0) goto LAB_001ca5b1;
LAB_001ca64d:
      sVar9 = local_40;
      ppuVar1 = local_58;
      ppuVar2 = local_50;
      if (n0 != 0) goto joined_r0x001ca655;
      if (local_40 == 0) {
        return;
      }
LAB_001ca66f:
      __n = sVar9 << 3;
LAB_001ca6e1:
      memcpy(local_38,local_58,__n);
      return;
    }
    if (iVar4 == 0) {
      if (-1 < iVar5) {
        if (iVar5 != 0) {
LAB_001ca0b0:
          lVar8 = 0;
          do {
            *(uchar **)((long)local_38 + lVar8) = __s2;
            if (local_48 == 1) {
              local_38 = (uchar **)((long)local_38 + lVar8 + 8);
              goto LAB_001ca64d;
            }
            __s2 = *(uchar **)((long)local_60 + lVar8 + 8);
            if (__s2 == (uchar *)0x0) goto LAB_001ca5cc;
            puVar12 = *local_50;
            if (puVar12 == (uchar *)0x0) goto LAB_001ca703;
            iVar4 = strcmp((char *)__s2,(char *)puVar12);
            bVar6 = iVar4 == 0 | 8;
            if (iVar4 < 0) {
              bVar6 = 10;
            }
            lVar8 = lVar8 + 8;
            local_48 = local_48 - 1;
          } while (bVar6 == 10);
          local_38 = (uchar **)((long)local_38 + lVar8);
          if (bVar6 == 8) {
            local_60 = (uchar **)((long)local_60 + lVar8);
            goto LAB_001ca473;
          }
          local_60 = (uchar **)((long)local_60 + lVar8);
        }
        goto LAB_001ca3f0;
      }
LAB_001ca473:
      *local_38 = puVar12;
      puVar12 = *local_58;
      local_58 = local_58 + 1;
      local_38[1] = puVar12;
      local_38 = local_38 + 2;
      local_40 = local_40 - 1;
      n0 = n0 - 1;
      sVar9 = local_40;
      local_48 = local_48;
      if (n0 == 0) goto LAB_001ca616;
      local_50 = local_50 + 1;
      from1_00 = local_58;
      sVar9 = local_48;
      ppuVar1 = local_60;
      ppuVar2 = local_50;
      if (local_40 != 0) goto LAB_001ca5b1;
joined_r0x001ca655:
      local_58 = ppuVar2;
      from1_00 = ppuVar1;
      local_40 = sVar9;
      if (local_40 != 0) {
LAB_001ca6a6:
        merge_2way_unstable(local_58,n0,from1_00,local_40,local_38);
        return;
      }
      __n = n0 << 3;
      goto LAB_001ca6e1;
    }
    lVar8 = 4;
    if (0 < iVar5) goto LAB_001c9cb8;
    if (iVar5 == 0) goto LAB_001ca574;
    iVar4 = strcmp((char *)puVar12,(char *)__s2);
    if (iVar4 < 0) {
LAB_001ca206:
      lVar8 = 0;
LAB_001ca213:
      local_40 = local_40 - 1;
      *(uchar **)((long)local_38 + lVar8) = __s2_00;
      if (local_40 != 0) {
        __s2_00 = *(uchar **)((long)local_58 + lVar8 + 8);
        if (__s2_00 != (uchar *)0x0) {
          puVar12 = *local_50;
          if (puVar12 != (uchar *)0x0) {
            iVar4 = strcmp((char *)__s2_00,(char *)puVar12);
            bVar6 = 0xd;
            if (iVar4 < 0) break;
            if (iVar4 == 0) {
              lVar10 = (long)local_38 + lVar8;
              local_58 = (uchar **)((long)local_58 + lVar8 + 8);
LAB_001ca46b:
              local_38 = (uchar **)(lVar10 + 8);
              goto LAB_001ca473;
            }
            if (*local_60 != (uchar *)0x0) {
              iVar4 = strcmp((char *)__s2_00,(char *)*local_60);
              if (iVar4 < 0) {
                local_38 = (uchar **)((long)local_38 + lVar8 + 8);
                local_58 = (uchar **)((long)local_58 + lVar8 + 8);
                goto LAB_001c9d0c;
              }
              bVar6 = iVar4 == 0 ^ 5;
              break;
            }
          }
          goto LAB_001ca703;
        }
        goto LAB_001ca5cc;
      }
LAB_001ca5f9:
      local_38 = (uchar **)((long)local_38 + lVar8 + 8);
      sVar9 = local_48;
      goto LAB_001ca68c;
    }
    lVar8 = 6;
    if (iVar4 != 0) goto LAB_001c9cb8;
LAB_001ca35a:
    lVar8 = 0;
    do {
      *(uchar **)((long)local_38 + lVar8) = __s2_00;
      if (local_40 == 1) {
        local_38 = (uchar **)((long)local_38 + lVar8 + 8);
        sVar9 = local_48;
        goto LAB_001ca68c;
      }
      __s2_00 = *(uchar **)((long)local_58 + lVar8 + 8);
      if (__s2_00 == (uchar *)0x0) goto LAB_001ca5cc;
      puVar12 = *local_50;
      if (puVar12 == (uchar *)0x0) goto LAB_001ca703;
      iVar4 = strcmp((char *)__s2_00,(char *)puVar12);
      cVar3 = (iVar4 == 0) * '\x03' + '\x06';
      if (iVar4 < 0) {
        cVar3 = '\x0e';
      }
      lVar8 = lVar8 + 8;
      local_40 = local_40 - 1;
    } while (cVar3 == '\x0e');
    if (cVar3 == '\x06') {
      local_38 = (uchar **)((long)local_38 + lVar8);
      local_58 = (uchar **)((long)local_58 + lVar8);
      goto LAB_001ca4d0;
    }
    local_38 = (uchar **)((long)local_38 + lVar8);
    local_58 = (uchar **)((long)local_58 + lVar8);
LAB_001ca3f0:
    *local_38 = puVar12;
    from1_00 = local_58 + 1;
    local_38[1] = *local_58;
    puVar12 = *local_60;
    local_60 = local_60 + 1;
    local_38[2] = puVar12;
    local_38 = local_38 + 3;
    local_40 = local_40 - 1;
    local_48 = local_48 - 1;
    n0 = n0 - 1;
    sVar9 = local_40;
    local_58 = from1_00;
    if (n0 == 0) {
LAB_001ca616:
      local_40 = local_48;
      if (sVar9 == 0) {
LAB_001ca6bc:
        if (local_40 == 0) {
          return;
        }
        __n = local_40 << 3;
        local_58 = local_60;
        goto LAB_001ca6e1;
      }
      from1_00 = local_60;
      n0 = sVar9;
      if (local_40 != 0) goto LAB_001ca6a6;
      goto LAB_001ca66f;
    }
    local_58 = local_50 + 1;
    sVar9 = local_48;
    ppuVar1 = local_60;
    ppuVar2 = local_58;
    if (local_40 == 0) goto joined_r0x001ca655;
    local_50 = local_58;
    if (local_48 == 0) goto LAB_001ca6a6;
LAB_001ca5b1:
    local_58 = from1_00;
    puVar12 = *local_50;
  } while( true );
  lVar8 = lVar8 + 8;
  if (bVar6 != 0xd) goto code_r0x001ca2a0;
  goto LAB_001ca213;
code_r0x001ca2a0:
  local_38 = (uchar **)((long)local_38 + lVar8);
  if (bVar6 == 5) {
    local_58 = (uchar **)((long)local_58 + lVar8);
LAB_001ca001:
    lVar8 = 0;
    do {
      n0 = n0 - 1;
      *(uchar **)((long)local_38 + lVar8) = puVar12;
      if (n0 == 0) goto LAB_001ca5eb;
      puVar12 = *(uchar **)((long)local_50 + lVar8 + 8);
      if (puVar12 == (uchar *)0x0) goto LAB_001ca5cc;
      __s2 = *local_60;
      if (__s2 == (uchar *)0x0) goto LAB_001ca703;
      iVar4 = strcmp((char *)puVar12,(char *)__s2);
      bVar6 = 5;
      if (-1 < iVar4) {
        if (iVar4 == 0) {
          local_38 = (uchar **)((long)local_38 + lVar8 + 8);
          local_50 = (uchar **)((long)local_50 + lVar8 + 8);
          goto LAB_001ca4d0;
        }
        if (*local_58 == (uchar *)0x0) goto LAB_001ca703;
        iVar4 = strcmp((char *)puVar12,(char *)*local_58);
        if (iVar4 < 0) {
          local_38 = (uchar **)((long)local_38 + lVar8 + 8);
          local_50 = (uchar **)((long)local_50 + lVar8 + 8);
          goto LAB_001c9f07;
        }
        bVar6 = iVar4 == 0 ^ 0xb;
      }
      lVar8 = lVar8 + 8;
    } while (bVar6 == 5);
    local_38 = (uchar **)((long)local_38 + lVar8);
    if (bVar6 != 10) {
      local_50 = (uchar **)((long)local_50 + lVar8);
LAB_001ca135:
      lVar8 = 0;
LAB_001ca13f:
      lVar10 = lVar8;
      local_48 = local_48 - 1;
      *(uchar **)((long)local_38 + lVar10) = __s2;
      if (local_48 != 0) {
        __s2 = *(uchar **)((long)local_60 + lVar10 + 8);
        if (__s2 != (uchar *)0x0) {
          __s2_00 = *local_58;
          if (__s2_00 != (uchar *)0x0) {
            iVar4 = strcmp((char *)__s2,(char *)__s2_00);
            iVar5 = 0xb;
            if (iVar4 < 0) goto LAB_001ca1be;
            if (iVar4 == 0) {
              lVar11 = (long)local_38 + lVar10;
              local_60 = (uchar **)((long)local_60 + lVar10 + 8);
LAB_001ca56c:
              local_38 = (uchar **)(lVar11 + 8);
              goto LAB_001ca574;
            }
            if (*local_50 != (uchar *)0x0) {
              iVar4 = strcmp((char *)__s2,(char *)*local_50);
              iVar5 = 0xd;
              if (iVar4 == 0) {
                iVar5 = 0x18;
              }
              if (-1 < iVar4) goto LAB_001ca1be;
              goto LAB_001ca1d9;
            }
          }
          goto LAB_001ca703;
        }
        goto LAB_001ca5cc;
      }
      local_38 = (uchar **)((long)local_38 + lVar10 + 8);
      goto LAB_001ca64d;
    }
    local_50 = (uchar **)((long)local_50 + lVar8);
    goto LAB_001ca0b0;
  }
  local_58 = (uchar **)((long)local_58 + lVar8);
  goto LAB_001ca2c7;
LAB_001ca1be:
  lVar8 = lVar10 + 8;
  if (iVar5 != 0xb) goto code_r0x001ca1cb;
  goto LAB_001ca13f;
code_r0x001ca1cb:
  if (iVar5 == 0xd) {
    local_38 = (uchar **)((long)local_38 + lVar8);
    local_60 = (uchar **)((long)local_60 + lVar8);
    goto LAB_001ca206;
  }
  if (iVar5 != 0xf) {
    local_38 = (uchar **)((long)local_38 + lVar8);
    local_60 = (uchar **)((long)local_60 + lVar8);
    goto LAB_001ca35a;
  }
LAB_001ca1d9:
  local_38 = (uchar **)((long)local_38 + lVar10 + 8);
  local_60 = (uchar **)((long)local_60 + lVar10 + 8);
  while( true ) {
    lVar10 = 0;
    do {
      lVar8 = lVar10;
      local_40 = local_40 - 1;
      *(uchar **)((long)local_38 + lVar8) = __s2_00;
      if (local_40 == 0) goto LAB_001ca5f9;
      __s2_00 = *(uchar **)((long)local_58 + lVar8 + 8);
      if (__s2_00 == (uchar *)0x0) goto LAB_001ca5cc;
      __s2 = *local_60;
      if (__s2 == (uchar *)0x0) goto LAB_001ca703;
      iVar4 = strcmp((char *)__s2_00,(char *)__s2);
      iVar5 = 0xf;
      if (-1 < iVar4) {
        if (iVar4 == 0) {
          lVar11 = (long)local_38 + lVar8;
          local_58 = (uchar **)((long)local_58 + lVar8 + 8);
          goto LAB_001ca56c;
        }
        if (*local_50 == (uchar *)0x0) goto LAB_001ca703;
        iVar4 = strcmp((char *)__s2_00,(char *)*local_50);
        iVar5 = 0x13;
        if (iVar4 != 0) {
          iVar5 = 7;
        }
        if (iVar4 < 0) goto LAB_001c9ea0;
      }
      uVar7 = iVar5 - 7U >> 2;
      lVar10 = lVar8 + 8;
    } while (uVar7 == 2);
    if (iVar5 - 7U >> 2 != 0) break;
    local_38 = (uchar **)((long)local_38 + lVar10);
    local_58 = (uchar **)((long)local_58 + lVar10);
LAB_001c9f07:
    lVar8 = 0;
    do {
      local_48 = local_48 - 1;
      *(uchar **)((long)local_38 + lVar8) = __s2;
      if (local_48 == 0) {
        local_38 = (uchar **)((long)local_38 + lVar8 + 8);
        goto LAB_001ca64d;
      }
      __s2 = *(uchar **)((long)local_60 + lVar8 + 8);
      if (__s2 == (uchar *)0x0) goto LAB_001ca5cc;
      puVar12 = *local_50;
      if (puVar12 == (uchar *)0x0) goto LAB_001ca703;
      iVar4 = strcmp((char *)__s2,(char *)puVar12);
      iVar5 = 7;
      if (-1 < iVar4) {
        if (iVar4 == 0) {
          local_38 = (uchar **)((long)local_38 + lVar8 + 8);
          local_60 = (uchar **)((long)local_60 + lVar8 + 8);
          goto LAB_001ca4d0;
        }
        if (*local_58 == (uchar *)0x0) goto LAB_001ca703;
        iVar4 = strcmp((char *)__s2,(char *)*local_58);
        iVar5 = 3;
        if (iVar4 == 0) {
          iVar5 = 0x16;
        }
        if (iVar4 < 0) {
          local_38 = (uchar **)((long)local_38 + lVar8 + 8);
          local_60 = (uchar **)((long)local_60 + lVar8 + 8);
          goto LAB_001ca001;
        }
      }
      lVar8 = lVar8 + 8;
    } while (iVar5 == 7);
    local_38 = (uchar **)((long)local_38 + lVar8);
    if (iVar5 != 3) {
      local_60 = (uchar **)((long)local_60 + lVar8);
      goto LAB_001ca2c7;
    }
    local_60 = (uchar **)((long)local_60 + lVar8);
LAB_001c9d0c:
    lVar8 = 0;
    do {
      n0 = n0 - 1;
      *(uchar **)((long)local_38 + lVar8) = puVar12;
      if (n0 == 0) goto LAB_001ca5eb;
      puVar12 = *(uchar **)((long)local_50 + lVar8 + 8);
      if (puVar12 == (uchar *)0x0) goto LAB_001ca5cc;
      __s2_00 = *local_58;
      if (__s2_00 == (uchar *)0x0) goto LAB_001ca703;
      iVar4 = strcmp((char *)puVar12,(char *)__s2_00);
      bVar6 = 3;
      if (-1 < iVar4) {
        if (iVar4 == 0) {
          lVar10 = (long)local_38 + lVar8;
          local_50 = (uchar **)((long)local_50 + lVar8 + 8);
          goto LAB_001ca46b;
        }
        if (*local_60 == (uchar *)0x0) goto LAB_001ca703;
        iVar4 = strcmp((char *)puVar12,(char *)*local_60);
        if (iVar4 < 0) {
          local_38 = (uchar **)((long)local_38 + lVar8 + 8);
          local_50 = (uchar **)((long)local_50 + lVar8 + 8);
          goto LAB_001ca206;
        }
        bVar6 = iVar4 == 0 ^ 0xf;
      }
      lVar8 = lVar8 + 8;
    } while (bVar6 == 3);
    local_38 = (uchar **)((long)local_38 + lVar8);
    if (bVar6 == 0xe) {
      local_50 = (uchar **)((long)local_50 + lVar8);
      goto LAB_001ca35a;
    }
    local_50 = (uchar **)((long)local_50 + lVar8);
  }
  if (uVar7 != 1) {
    local_38 = (uchar **)((long)local_38 + lVar10);
    local_58 = (uchar **)((long)local_58 + lVar10);
    goto LAB_001ca0b0;
  }
LAB_001c9ea0:
  local_38 = (uchar **)((long)local_38 + lVar8 + 8);
  local_58 = (uchar **)((long)local_58 + lVar8 + 8);
  goto LAB_001ca135;
LAB_001ca5eb:
  local_38 = (uchar **)((long)local_38 + lVar8 + 8);
  sVar9 = local_40;
  local_48 = local_48;
  goto LAB_001ca616;
}

Assistant:

static void
merge_3way_unstable(unsigned char** restrict from0, size_t n0,
                    unsigned char** restrict from1, size_t n1,
                    unsigned char** restrict from2, size_t n2,
                    unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2<<"\n";

initial:
{
	const int cmp01 = cmp(*from0, *from1);
	const int cmp12 = cmp(*from1, *from2);
	int cmp02 = 0;
	if (cmp01 < 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		cmp02 = cmp(*from0, *from2);
		if (cmp02 < 0)  { goto state0lt2lt1; }
		if (cmp02 == 0) { goto state0eq2lt1; }
		goto state2lt0lt1;
	}
	if (cmp01 == 0) {
		if (cmp12 < 0)  { goto state0eq1lt2; }
		if (cmp12 == 0) { goto all_eq;       }
		goto state2lt0eq1;
	}
	if (cmp12 > 0)  { goto state2lt1lt0; }
	if (cmp12 == 0) { goto state1eq2lt0; }
	cmp02 = cmp(*from0, *from2);
	if (cmp02 < 0)  { goto state1lt0lt2; }
	if (cmp02 == 0) { goto state1lt0eq2; }
	goto state1lt2lt0;
}

#define StrictCase(a,b,c)                                                      \
	state##a##lt##b##lt##c:                                                \
	{                                                                      \
		*result++ = *from##a++;                                        \
		if (--n##a == 0) goto finish##a;                               \
		int cmpab = cmp(*from##a, *from##b);                           \
		if (cmpab < 0)  goto state##a##lt##b##lt##c;                   \
		if (cmpab == 0) goto state##a##eq##b##lt##c;                   \
		int cmpac = cmp(*from##a, *from##c);                           \
		if (cmpac < 0)  goto state##b##lt##a##lt##c;                   \
		if (cmpac == 0) goto state##b##lt##a##eq##c;                   \
		goto state##b##lt##c##lt##a;                                   \
	}
	StrictCase(0, 1, 2)
	StrictCase(0, 2, 1)
	StrictCase(1, 0, 2)
	StrictCase(1, 2, 0)
	StrictCase(2, 0, 1)
	StrictCase(2, 1, 0)
#undef StrictCase

#define EqLt(a,b,c)                                                            \
	static_assert(a < b, "a < b");                                         \
	state##a##eq##b##lt##c:                                                \
	{                                                                      \
		*result++ = *from ##a ++;                                      \
		*result++ = *from ##b ++;                                      \
		--n##a;                                                        \
		--n##b;                                                        \
		if (n##a == 0) goto finish ##a;                                \
		if (n##b == 0) goto finish ##b;                                \
		goto initial;                                                  \
	}
	EqLt(0, 1, 2)
	EqLt(0, 2, 1)
	EqLt(1, 2, 0)
state2eq0lt1: goto state0eq2lt1;
state1eq0lt2: goto state0eq1lt2;
state2eq1lt0: goto state1eq2lt0;
#undef EqLt

#define LtEq(a,b,c)                                                            \
	static_assert(b < c, "b < c");                                         \
	state##a##lt##b##eq##c:                                                \
	{                                                                      \
		*result++ = *from##a++;                                        \
		if (--n##a == 0) goto finish##a;                               \
		int cmpab = cmp(*from##a, *from##b);                           \
		if (cmpab < 0)  goto state##a##lt##b##eq##c;                   \
		if (cmpab == 0) goto all_eq;                                   \
		goto state##b##eq##c##lt## a;                                  \
	}
	LtEq(0, 1, 2)
	LtEq(1, 0, 2)
	LtEq(2, 0, 1)
state0lt2eq1: goto state0lt1eq2;
state1lt2eq0: goto state1lt0eq2;
state2lt1eq0: goto state2lt0eq1;
#undef LtEq

all_eq:
{
	*result++ = *from0++;
	*result++ = *from1++;
	*result++ = *from2++;
	--n0;
	--n1;
	--n2;
	if (n0==0) goto finish0;
	if (n1==0) goto finish1;
	if (n2==0) goto finish2;
	goto initial;
}

finish0:
	assert(n0 == 0);
	if (n1) {
		if (n2) {
			merge_2way_unstable(from1, n1, from2, n2, result);
		} else {
			(void) memcpy(result, from1, n1*sizeof(unsigned char*));
		}
	} else if (n2) {
		(void) memcpy(result, from2, n2*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
finish1:
	assert(n1 == 0);
	if (n0) {
		if (n2) {
			merge_2way_unstable(from0, n0, from2, n2, result);
		} else {
			(void) memcpy(result, from0, n0*sizeof(unsigned char*));
		}
	} else if (n2) {
		(void) memcpy(result, from2, n2*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
finish2:
	assert(n2 == 0);
	if (n0) {
		if (n1) {
			merge_2way_unstable(from0, n0, from1, n1, result);
		} else {
			(void) memcpy(result, from0, n0*sizeof(unsigned char*));
		}
	} else if (n1) {
		(void) memcpy(result, from1, n1*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
}